

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NeuralNetwork.pb.cc
# Opt level: O2

void __thiscall
CoreML::Specification::PoolingLayerParams::SerializeWithCachedSizes
          (PoolingLayerParams *this,CodedOutputStream *output)

{
  uint32 uVar1;
  uint64 uVar2;
  int iVar3;
  int iVar4;
  
  if (this->type_ != 0) {
    google::protobuf::internal::WireFormatLite::WriteEnum(1,this->type_,output);
  }
  iVar4 = (this->kernelsize_).current_size_;
  if (0 < iVar4) {
    google::protobuf::io::CodedOutputStream::WriteVarint32(output,0x52);
    google::protobuf::io::CodedOutputStream::WriteVarint32
              (output,this->_kernelsize_cached_byte_size_);
    iVar4 = (this->kernelsize_).current_size_;
  }
  iVar3 = 0;
  if (iVar4 < 1) {
    iVar4 = 0;
    iVar3 = 0;
  }
  for (; iVar4 != iVar3; iVar3 = iVar3 + 1) {
    uVar2 = kernelsize(this,iVar3);
    google::protobuf::io::CodedOutputStream::WriteVarint64(output,uVar2);
  }
  iVar4 = (this->stride_).current_size_;
  if (0 < iVar4) {
    google::protobuf::io::CodedOutputStream::WriteVarint32(output,0xa2);
    google::protobuf::io::CodedOutputStream::WriteVarint32(output,this->_stride_cached_byte_size_);
    iVar4 = (this->stride_).current_size_;
  }
  iVar3 = 0;
  if (iVar4 < 1) {
    iVar4 = 0;
  }
  for (; iVar4 != iVar3; iVar3 = iVar3 + 1) {
    uVar2 = stride(this,iVar3);
    google::protobuf::io::CodedOutputStream::WriteVarint64(output,uVar2);
  }
  uVar1 = this->_oneof_case_[0];
  if (uVar1 == 0x1e) {
    google::protobuf::internal::WireFormatLite::WriteMessage
              (0x1e,&((this->PoolingPaddingType_).valid_)->super_MessageLite,output);
    uVar1 = this->_oneof_case_[0];
  }
  if (uVar1 == 0x1f) {
    google::protobuf::internal::WireFormatLite::WriteMessage
              (0x1f,&((this->PoolingPaddingType_).valid_)->super_MessageLite,output);
    uVar1 = this->_oneof_case_[0];
  }
  if (uVar1 == 0x20) {
    google::protobuf::internal::WireFormatLite::WriteMessage
              (0x20,&((this->PoolingPaddingType_).valid_)->super_MessageLite,output);
  }
  if (this->avgpoolexcludepadding_ == true) {
    google::protobuf::internal::WireFormatLite::WriteBool(0x32,true,output);
  }
  if (this->globalpooling_ == true) {
    google::protobuf::internal::WireFormatLite::WriteBool(0x3c,true,output);
    return;
  }
  return;
}

Assistant:

void PoolingLayerParams::SerializeWithCachedSizes(
    ::google::protobuf::io::CodedOutputStream* output) const {
  // @@protoc_insertion_point(serialize_start:CoreML.Specification.PoolingLayerParams)
  ::google::protobuf::uint32 cached_has_bits = 0;
  (void) cached_has_bits;

  // .CoreML.Specification.PoolingLayerParams.PoolingType type = 1;
  if (this->type() != 0) {
    ::google::protobuf::internal::WireFormatLite::WriteEnum(
      1, this->type(), output);
  }

  // repeated uint64 kernelSize = 10;
  if (this->kernelsize_size() > 0) {
    ::google::protobuf::internal::WireFormatLite::WriteTag(10, ::google::protobuf::internal::WireFormatLite::WIRETYPE_LENGTH_DELIMITED, output);
    output->WriteVarint32(_kernelsize_cached_byte_size_);
  }
  for (int i = 0, n = this->kernelsize_size(); i < n; i++) {
    ::google::protobuf::internal::WireFormatLite::WriteUInt64NoTag(
      this->kernelsize(i), output);
  }

  // repeated uint64 stride = 20;
  if (this->stride_size() > 0) {
    ::google::protobuf::internal::WireFormatLite::WriteTag(20, ::google::protobuf::internal::WireFormatLite::WIRETYPE_LENGTH_DELIMITED, output);
    output->WriteVarint32(_stride_cached_byte_size_);
  }
  for (int i = 0, n = this->stride_size(); i < n; i++) {
    ::google::protobuf::internal::WireFormatLite::WriteUInt64NoTag(
      this->stride(i), output);
  }

  // .CoreML.Specification.ValidPadding valid = 30;
  if (has_valid()) {
    ::google::protobuf::internal::WireFormatLite::WriteMessage(
      30, *PoolingPaddingType_.valid_, output);
  }

  // .CoreML.Specification.SamePadding same = 31;
  if (has_same()) {
    ::google::protobuf::internal::WireFormatLite::WriteMessage(
      31, *PoolingPaddingType_.same_, output);
  }

  // .CoreML.Specification.PoolingLayerParams.ValidCompletePadding includeLastPixel = 32;
  if (has_includelastpixel()) {
    ::google::protobuf::internal::WireFormatLite::WriteMessage(
      32, *PoolingPaddingType_.includelastpixel_, output);
  }

  // bool avgPoolExcludePadding = 50;
  if (this->avgpoolexcludepadding() != 0) {
    ::google::protobuf::internal::WireFormatLite::WriteBool(50, this->avgpoolexcludepadding(), output);
  }

  // bool globalPooling = 60;
  if (this->globalpooling() != 0) {
    ::google::protobuf::internal::WireFormatLite::WriteBool(60, this->globalpooling(), output);
  }

  // @@protoc_insertion_point(serialize_end:CoreML.Specification.PoolingLayerParams)
}